

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O1

void Cbs0_ManStop(Cbs0_Man_t *p)

{
  Vec_Int_t *__ptr;
  Gia_Obj_t **ppGVar1;
  
  __ptr = p->vModel;
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  ppGVar1 = (p->pProp).pData;
  if (ppGVar1 != (Gia_Obj_t **)0x0) {
    free(ppGVar1);
    (p->pProp).pData = (Gia_Obj_t **)0x0;
  }
  ppGVar1 = (p->pJust).pData;
  if (ppGVar1 != (Gia_Obj_t **)0x0) {
    free(ppGVar1);
    (p->pJust).pData = (Gia_Obj_t **)0x0;
  }
  if (p != (Cbs0_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Cbs0_ManStop( Cbs0_Man_t * p )
{
    Vec_IntFree( p->vModel );
    ABC_FREE( p->pProp.pData );
    ABC_FREE( p->pJust.pData );
    ABC_FREE( p );
}